

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::HasProperty
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,JavascriptString *propertyNameString
          )

{
  code *pcVar1;
  Type *pTVar2;
  bool bVar3;
  charcount_t cVar4;
  char16 *pcVar5;
  undefined4 *puVar6;
  long lVar7;
  Type *pTVar8;
  undefined1 local_38 [8];
  CharacterBuffer<char16_t> propertyName;
  
  pcVar5 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  bVar3 = PropertyRecord::IsPropertyNameNumeric(pcVar5,cVar4);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x1e7,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pcVar5 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet
            ((WriteBarrierPtr<const_char16_t> *)local_38,pcVar5);
  lVar7 = -1;
  pTVar2 = this->descriptors;
  propertyName.string.ptr._0_4_ = cVar4;
  do {
    pTVar8 = pTVar2;
    lVar7 = lVar7 + 1;
    if (this->propertyCount <= lVar7) {
      return 0;
    }
    bVar3 = PropertyRecord::Equals((pTVar8->Id).ptr,(CharacterBuffer<char16_t> *)local_38);
    pTVar2 = pTVar8 + 1;
  } while (!bVar3);
  return (uint)(((pTVar8->field_1).Attributes & 8) == 0);
}

Assistant:

BOOL SimpleTypeHandler<size>::HasProperty(DynamicObject* instance, JavascriptString* propertyNameString)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->Equals(propertyName))
            {
                return !(descriptors[i].Attributes & PropertyDeleted);
            }
        }

        return false;
    }